

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  timediff_t tVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  curltime cVar11;
  curltime newer;
  curltime older;
  curltime older_00;
  int local_40 [2];
  time_t local_38;
  
  uVar5 = (data->set).timeout;
  if (uVar5 == 0 && !duringconnect) {
    return 0;
  }
  if (nowp == (curltime *)0x0) {
    cVar11 = Curl_now();
    nowp = (curltime *)&local_38;
    local_38 = cVar11.tv_sec;
    piVar10 = local_40;
    local_40[0] = cVar11.tv_usec;
    uVar5 = (data->set).timeout;
  }
  else {
    piVar10 = &nowp->tv_usec;
  }
  if (uVar5 == 0) {
    lVar7 = 0;
    lVar8 = 0;
    if (!duringconnect) goto LAB_00119fcc;
  }
  else {
    uVar1 = (data->progress).t_startop.tv_sec;
    uVar2 = (data->progress).t_startop.tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    cVar11.tv_usec = *piVar10;
    cVar11.tv_sec = nowp->tv_sec;
    cVar11._12_4_ = 0;
    older._12_4_ = 0;
    tVar6 = Curl_timediff(cVar11,older);
    lVar7 = (ulong)uVar5 - tVar6;
    if ((ulong)uVar5 - tVar6 == 0) {
      lVar7 = -1;
    }
    if (!duringconnect) {
      return lVar7;
    }
  }
  uVar5 = (data->set).connecttimeout;
  uVar9 = 300000;
  if (uVar5 != 0) {
    uVar9 = (ulong)uVar5;
  }
  uVar3 = (data->progress).t_startsingle.tv_sec;
  uVar4 = (data->progress).t_startsingle.tv_usec;
  older_00.tv_usec = uVar4;
  older_00.tv_sec = uVar3;
  newer.tv_usec = *piVar10;
  newer.tv_sec = nowp->tv_sec;
  newer._12_4_ = 0;
  older_00._12_4_ = 0;
  tVar6 = Curl_timediff(newer,older_00);
  lVar8 = uVar9 - tVar6;
  if (uVar9 - tVar6 == 0) {
    lVar8 = -1;
  }
  if (lVar7 == 0) {
    return lVar8;
  }
LAB_00119fcc:
  if (lVar8 < lVar7) {
    lVar7 = lVar8;
  }
  return lVar7;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  timediff_t timeleft_ms = 0;
  timediff_t ctimeleft_ms = 0;
  struct curltime now;

  /* The duration of a connect and the total transfer are calculated from two
     different time-stamps. It can end up with the total timeout being reached
     before the connect timeout expires and we must acknowledge whichever
     timeout that is reached first. The total timeout is set per entire
     operation, while the connect timeout is set per connect. */
  if(data->set.timeout <= 0 && !duringconnect)
    return 0; /* no timeout in place or checked, return "no limit" */

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  if(data->set.timeout > 0) {
    timeleft_ms = data->set.timeout -
                  Curl_timediff(*nowp, data->progress.t_startop);
    if(!timeleft_ms)
      timeleft_ms = -1; /* 0 is "no limit", fake 1 ms expiry */
    if(!duringconnect)
      return timeleft_ms; /* no connect check, this is it */
  }

  if(duringconnect) {
    timediff_t ctimeout_ms = (data->set.connecttimeout > 0) ?
      data->set.connecttimeout : DEFAULT_CONNECT_TIMEOUT;
    ctimeleft_ms = ctimeout_ms -
                   Curl_timediff(*nowp, data->progress.t_startsingle);
    if(!ctimeleft_ms)
      ctimeleft_ms = -1; /* 0 is "no limit", fake 1 ms expiry */
    if(!timeleft_ms)
      return ctimeleft_ms; /* no general timeout, this is it */
  }
  /* return minimal time left or max amount already expired */
  return (ctimeleft_ms < timeleft_ms) ? ctimeleft_ms : timeleft_ms;
}